

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3RowSetNext(RowSet *p,i64 *pRowid)

{
  RowSetEntry *pRVar1;
  i64 *pRowid_local;
  RowSet *p_local;
  
  if ((p->rsFlags & 2) == 0) {
    if ((p->rsFlags & 1) == 0) {
      pRVar1 = rowSetEntrySort(p->pEntry);
      p->pEntry = pRVar1;
    }
    p->rsFlags = p->rsFlags | 3;
  }
  if (p->pEntry == (RowSetEntry *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    *pRowid = p->pEntry->v;
    p->pEntry = p->pEntry->pRight;
    if (p->pEntry == (RowSetEntry *)0x0) {
      sqlite3RowSetClear(p);
    }
    p_local._4_4_ = 1;
  }
  return p_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3RowSetNext(RowSet *p, i64 *pRowid){
  assert( p!=0 );
  assert( p->pForest==0 );  /* Cannot be used with sqlite3RowSetText() */

  /* Merge the forest into a single sorted list on first call */
  if( (p->rsFlags & ROWSET_NEXT)==0 ){  /*OPTIMIZATION-IF-FALSE*/
    if( (p->rsFlags & ROWSET_SORTED)==0 ){  /*OPTIMIZATION-IF-FALSE*/
      p->pEntry = rowSetEntrySort(p->pEntry);
    }
    p->rsFlags |= ROWSET_SORTED|ROWSET_NEXT;
  }

  /* Return the next entry on the list */
  if( p->pEntry ){
    *pRowid = p->pEntry->v;
    p->pEntry = p->pEntry->pRight;
    if( p->pEntry==0 ){ /*OPTIMIZATION-IF-TRUE*/
      /* Free memory immediately, rather than waiting on sqlite3_finalize() */
      sqlite3RowSetClear(p);
    }
    return 1;
  }else{
    return 0;
  }
}